

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O1

void ParseOldDecoration(FScanner *sc,EDefinitionType def)

{
  uint *puVar1;
  double dVar2;
  PClassActor *cls;
  BYTE *pBVar3;
  undefined1 auVar4 [16];
  PInt *pPVar5;
  uint32 uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ClassReg *pCVar10;
  PClassActor *info;
  undefined8 extraout_RAX;
  FState *pFVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  WORD *pWVar15;
  FScanner *sc_00;
  FScanner *sc_01;
  FScanner *sc_02;
  FScanner *sc_03;
  long lVar16;
  char *pcVar17;
  FState *pFVar18;
  double dVar19;
  TArray<FState,_FState> StateArray;
  FExtraInfo extra;
  char sprite [5];
  FState icecopy;
  Baggage bag;
  undefined1 local_168 [80];
  double local_118;
  Conversion *pCStack_110;
  uint32 local_fc;
  undefined1 local_f8;
  undefined4 local_f4;
  FxExpression *local_f0;
  FxDamageValue *local_e8;
  FName local_e0;
  int local_dc;
  undefined1 local_d8 [16];
  pair<const_PType_*,_unsigned_int> *local_c8;
  undefined8 uStack_c0;
  PClass *local_b8;
  _func_int **local_b0;
  FName local_a8;
  FName local_a4;
  undefined1 local_a0 [48];
  FState *local_70;
  FState *pFStack_68;
  FStateLabels *local_60;
  undefined1 local_58 [16];
  DDropItem *local_48;
  FString local_40;
  int local_38;
  
  local_a0._0_8_ = FString::NullString.Nothing;
  local_58._0_8_ = (FState *)0x0;
  local_58._8_8_ = (PainChanceList *)0x0;
  local_a0._32_8_ = (PClassActor *)0x0;
  local_a0._40_8_ = (PClassActor *)0x0;
  local_70 = (FState *)0x0;
  pFStack_68 = (FState *)0x0;
  local_60 = (FStateLabels *)0xffffffffffffffff;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_40.Chars = FString::NullString.Nothing;
  local_38 = 0;
  local_168._0_8_ = (FState *)0x0;
  local_168._8_8_ = (PClass *)0x0;
  if (def == DEF_Pickup) {
    pCVar10 = &AFakeInventory::RegistrationInfo;
  }
  else {
    pCVar10 = &AActor::RegistrationInfo;
  }
  cls = (PClassActor *)pCVar10->MyClass;
  FScanner::MustGetString(sc);
  local_dc = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  local_a4.Index = local_dc;
  info = (PClassActor *)
         PClass::CreateDerivedClass
                   ((PClass *)cls,&local_a4,
                    *(uint *)&(cls->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType
                              .super_PType.super_DObject.field_0x24);
  local_48 = (DDropItem *)0x0;
  local_a0[0x10] = false;
  local_a0[0x11] = false;
  local_a0._20_4_ = 0;
  FStateDefinitions::MakeStateDefines((FStateDefinitions *)(local_a0 + 0x20),cls);
  local_a0._8_8_ = info;
  FString::operator=((FString *)local_a0,
                     FName::NameData.NameArray
                     [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
  info->GameFilter = '\0';
  FScanner::MustGetStringName(sc,"{");
  local_118 = 0.0;
  pCStack_110 = (Conversion *)0x0;
  local_168._64_8_ = (Node *)0x0;
  local_168._72_8_ = (Node *)0x0;
  local_168._48_8_ = (PType *)0x0;
  local_168._56_8_ = (PSymbolTable *)0x0;
  local_168._32_8_ = 0;
  local_168._40_8_ = 0;
  pBVar3 = (info->super_PClass).Defaults;
  local_f8 = 0;
  local_fc = 0x31544e54;
  FScanner::MustGetString(sc);
  bVar7 = FScanner::Compare(sc,"}");
  if (!bVar7) {
    local_168._28_4_ = def | DEF_Pickup;
    local_b0 = (_func_int **)&PTR__FxConstant_008682d0;
    do {
      bVar7 = FScanner::Compare(sc,"DoomEdNum");
      if (bVar7) {
        FScanner::MustGetNumber(sc);
        if (sc->Number - 0x8000U < 0xffff7fff) {
          FScanner::ScriptError(sc,"DoomEdNum must be in the range [-1,32767]");
        }
        *(SWORD *)(local_a0._8_8_ + 0x102) = (SWORD)sc->Number;
        uVar6 = local_fc;
      }
      else {
        bVar7 = FScanner::Compare(sc,"SpawnNum");
        if (bVar7) {
          FScanner::MustGetNumber(sc);
          if (0xff < (uint)sc->Number) {
            FScanner::ScriptError(sc,"SpawnNum must be in the range [0,255]");
          }
          *(ushort *)(local_a0._8_8_ + 0xfe) = (ushort)(byte)sc->Number;
          uVar6 = local_fc;
        }
        else {
          bVar7 = FScanner::Compare(sc,"Sprite");
          if (!bVar7) {
            if ((local_168._28_4_ != DEF_Projectile) ||
               (bVar7 = FScanner::Compare(sc,"DeathSprite"), !bVar7)) {
              bVar7 = FScanner::Compare(sc,"Frames");
              if (bVar7) {
                FScanner::MustGetString(sc);
                local_168._40_4_ = local_168._12_4_;
                ParseSpriteFrames((PClassActor *)local_168,(TArray<FState,_FState> *)sc,sc_00);
                local_168._44_4_ = local_168._12_4_;
                uVar6 = local_fc;
              }
              else if ((local_168._28_4_ == DEF_Projectile) &&
                      (bVar7 = FScanner::Compare(sc,"DeathFrames"), bVar7)) {
                FScanner::MustGetString(sc);
                local_168._48_4_ = local_168._12_4_;
                ParseSpriteFrames((PClassActor *)local_168,(TArray<FState,_FState> *)sc,sc_01);
                local_168._52_4_ = local_168._12_4_;
                uVar6 = local_fc;
              }
              else if (def == DEF_BreakableDecoration) {
                bVar7 = FScanner::Compare(sc,"IceDeathFrames");
                if (bVar7) {
                  FScanner::MustGetString(sc);
                  local_168._56_4_ = local_168._12_4_;
                  ParseSpriteFrames((PClassActor *)local_168,(TArray<FState,_FState> *)sc,sc_02);
                  local_168._60_4_ = local_168._12_4_;
                  uVar6 = local_fc;
                }
                else {
                  bVar7 = FScanner::Compare(sc,"BurnDeathFrames");
                  if (bVar7) {
                    FScanner::MustGetString(sc);
                    local_168._64_4_ = local_168._12_4_;
                    ParseSpriteFrames((PClassActor *)local_168,(TArray<FState,_FState> *)sc,sc_03);
                    local_168._68_4_ = local_168._12_4_;
                    uVar6 = local_fc;
                  }
                  else {
                    bVar7 = FScanner::Compare(sc,"GenericIceDeath");
                    if (bVar7) {
                      local_168[0x4c] = 1;
                      uVar6 = local_fc;
                    }
                    else {
                      bVar7 = FScanner::Compare(sc,"BurnsAway");
                      if (bVar7) {
                        local_168[0x4a] = 1;
                        uVar6 = local_fc;
                      }
                      else {
                        bVar7 = FScanner::Compare(sc,"DiesAway");
                        if (!bVar7) goto LAB_0063c3a7;
                        local_168[0x4b] = 1;
                        uVar6 = local_fc;
                      }
                    }
                  }
                }
              }
              else {
LAB_0063c3a7:
                bVar7 = FScanner::Compare(sc,"Alpha");
                if (bVar7) {
                  FScanner::MustGetFloat(sc);
                  dVar2 = sc->Float;
                  dVar19 = 1.0;
                  if (dVar2 <= 1.0) {
                    dVar19 = dVar2;
                  }
                  *(ulong *)(pBVar3 + 0xf8) = -(ulong)(0.0 < dVar2) & (ulong)dVar19;
                  uVar6 = local_fc;
                }
                else {
                  bVar7 = FScanner::Compare(sc,"Scale");
                  if (bVar7) {
                    FScanner::MustGetFloat(sc);
                    dVar2 = sc->Float;
                    *(double *)(pBVar3 + 0xe0) = dVar2;
                    *(double *)(pBVar3 + 0xd8) = dVar2;
                    uVar6 = local_fc;
                  }
                  else {
                    bVar7 = FScanner::Compare(sc,"RenderStyle");
                    if (bVar7) {
                      FScanner::MustGetString(sc);
                      iVar8 = FScanner::MustMatchString(sc,RenderStyles,8);
                      *(FRenderStyle *)(pBVar3 + 0xe8) = LegacyRenderStyles[iVar8];
                      uVar6 = local_fc;
                    }
                    else {
                      bVar7 = FScanner::Compare(sc,"Radius");
                      if (bVar7) {
                        FScanner::MustGetFloat(sc);
                        *(double *)(pBVar3 + 0x158) = sc->Float;
                        uVar6 = local_fc;
                      }
                      else {
                        bVar7 = FScanner::Compare(sc,"Height");
                        if (bVar7) {
                          FScanner::MustGetFloat(sc);
                          *(double *)(pBVar3 + 0x160) = sc->Float;
                          uVar6 = local_fc;
                        }
                        else if (def == DEF_BreakableDecoration) {
                          bVar7 = FScanner::Compare(sc,"DeathHeight");
                          if (bVar7) {
                            FScanner::MustGetFloat(sc);
                            local_118 = sc->Float;
                            uVar6 = local_fc;
                          }
                          else {
                            bVar7 = FScanner::Compare(sc,"BurnHeight");
                            if (bVar7) {
                              FScanner::MustGetFloat(sc);
                              pCStack_110 = (Conversion *)sc->Float;
                              uVar6 = local_fc;
                            }
                            else {
                              bVar7 = FScanner::Compare(sc,"Health");
                              if (!bVar7) goto LAB_0063c578;
                              FScanner::MustGetNumber(sc);
                              *(int *)(pBVar3 + 0x1cc) = sc->Number;
                              uVar6 = local_fc;
                            }
                          }
                        }
                        else {
LAB_0063c578:
                          if (def == DEF_Projectile) {
                            bVar7 = FScanner::Compare(sc,"ExplosionRadius");
                            if (bVar7) {
                              FScanner::MustGetNumber(sc);
                              *(int *)(local_a0._8_8_ + 0x1a4) = sc->Number;
                            }
                            else {
                              bVar7 = FScanner::Compare(sc,"ExplosionDamage");
                              if (!bVar7) {
                                bVar7 = FScanner::Compare(sc,"DoNotHurtShooter");
                                if (bVar7) {
                                  *(bool *)(local_a0._8_8_ + 0x1a0) = true;
                                  uVar6 = local_fc;
                                }
                                else {
                                  bVar7 = FScanner::Compare(sc,"Damage");
                                  if (bVar7) {
                                    FScanner::MustGetNumber(sc);
                                    local_e8 = (FxDamageValue *)operator_new(0x50);
                                    local_f0 = (FxExpression *)operator_new(0x48);
                                    local_e0.Index = sc->Number;
                                    FScriptPosition::FScriptPosition((FScriptPosition *)local_d8,sc)
                                    ;
                                    local_f4 = (undefined4)
                                               CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                                    FxExpression::FxExpression(local_f0,(FScriptPosition *)local_d8)
                                    ;
                                    local_f0->_vptr_FxExpression = local_b0;
                                    pPVar5 = TypeSInt32;
                                    local_f0[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
                                    local_f0->ValueType = (PType *)pPVar5;
                                    *(int *)&local_f0[1].JumpAddresses.Array = local_e0.Index;
                                    local_f0->isresolved = true;
                                    local_f4 = 0;
                                    FxDamageValue::FxDamageValue(local_e8,local_f0,false);
                                    FString::~FString((FString *)local_d8);
                                    TArray<FxExpression_*,_FxExpression_*>::Grow
                                              (&ActorDamageFuncs.
                                                super_TArray<FxExpression_*,_FxExpression_*>,1);
                                    ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.
                                    Array[ActorDamageFuncs.
                                          super_TArray<FxExpression_*,_FxExpression_*>.Count] =
                                         &local_e8->super_FxExpression;
                                    ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.
                                    Count = ActorDamageFuncs.
                                            super_TArray<FxExpression_*,_FxExpression_*>.Count + 1;
                                    *(ulong *)(pBVar3 + 0x180) =
                                         (ulong)ActorDamageFuncs.
                                                super_TArray<FxExpression_*,_FxExpression_*>.Count;
                                    uVar6 = local_fc;
                                  }
                                  else {
                                    bVar7 = FScanner::Compare(sc,"DamageType");
                                    if (bVar7) {
                                      FScanner::MustGetString(sc);
                                      bVar7 = FScanner::Compare(sc,"Normal");
                                      if (bVar7) {
                                        pBVar3[0x3c4] = '\0';
                                        pBVar3[0x3c5] = '\0';
                                        pBVar3[0x3c6] = '\0';
                                        pBVar3[0x3c7] = '\0';
                                        uVar6 = local_fc;
                                      }
                                      else {
                                        iVar8 = FName::NameManager::FindName
                                                          (&FName::NameData,sc->String,false);
                                        *(int *)(pBVar3 + 0x3c4) = iVar8;
                                        uVar6 = local_fc;
                                      }
                                    }
                                    else {
                                      bVar7 = FScanner::Compare(sc,"Speed");
                                      if (!bVar7) goto LAB_0063c79f;
                                      FScanner::MustGetFloat(sc);
                                      *(double *)(pBVar3 + 0xc0) = sc->Float;
                                      uVar6 = local_fc;
                                    }
                                  }
                                }
                                goto LAB_0063c26a;
                              }
                              FScanner::MustGetNumber(sc);
                              *(int *)(local_a0._8_8_ + 0x1a8) = sc->Number;
                            }
                            local_168[0x4d] = 1;
                            uVar6 = local_fc;
                          }
                          else {
LAB_0063c79f:
                            bVar7 = FScanner::Compare(sc,"Mass");
                            if (bVar7) {
                              FScanner::MustGetFloat(sc);
                              *(int *)(pBVar3 + 0x3b8) = (int)sc->Float;
                              uVar6 = local_fc;
                            }
                            else {
                              bVar7 = FScanner::Compare(sc,"Translation1");
                              if (bVar7) {
                                FScanner::MustGetNumber(sc);
                                if (2 < (uint)sc->Number) {
                                  FScanner::ScriptError
                                            (sc,"Translation1 must be in the range [0,2]");
                                }
                                uVar9 = sc->Number;
                                uVar13 = 0x30000;
                              }
                              else {
                                bVar7 = FScanner::Compare(sc,"Translation2");
                                if (!bVar7) {
                                  if ((local_168._28_4_ == DEF_Projectile) &&
                                     (bVar7 = FScanner::Compare(sc,"DeathSound"), bVar7)) {
                                    FScanner::MustGetString(sc);
                                    iVar8 = S_FindSound(sc->String);
                                    *(int *)(pBVar3 + 0x390) = iVar8;
                                    uVar6 = local_fc;
                                  }
                                  else if ((def == DEF_BreakableDecoration) &&
                                          (bVar7 = FScanner::Compare(sc,"BurnDeathSound"), bVar7)) {
                                    FScanner::MustGetString(sc);
                                    iVar8 = S_FindSound(sc->String);
                                    *(int *)(pBVar3 + 0x394) = iVar8;
                                    uVar6 = local_fc;
                                  }
                                  else if (def == DEF_Projectile) {
                                    bVar7 = FScanner::Compare(sc,"SpawnSound");
                                    if (bVar7) {
                                      FScanner::MustGetString(sc);
                                      iVar8 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 900) = iVar8;
                                      uVar6 = local_fc;
                                    }
                                    else {
                                      bVar7 = FScanner::Compare(sc,"DoomBounce");
                                      if (bVar7) {
                                        pBVar3[0x2a8] = 0xaf;
                                        pBVar3[0x2a9] = '\0';
                                        uVar6 = local_fc;
                                      }
                                      else {
                                        bVar7 = FScanner::Compare(sc,"HereticBounce");
                                        if (bVar7) {
                                          pBVar3[0x2a8] = 0xc6;
                                          pBVar3[0x2a9] = '\0';
                                          uVar6 = local_fc;
                                        }
                                        else {
                                          bVar7 = FScanner::Compare(sc,"HexenBounce");
                                          if (!bVar7) goto LAB_0063c9a4;
                                          pBVar3[0x2a8] = 0x8f;
                                          pBVar3[0x2a9] = '\0';
                                          uVar6 = local_fc;
                                        }
                                      }
                                    }
                                  }
                                  else {
LAB_0063c9a4:
                                    if (def == DEF_Pickup) {
                                      bVar7 = FScanner::Compare(sc,"PickupSound");
                                      if (bVar7) {
                                        FScanner::MustGetString(sc);
                                        iVar8 = S_FindSound(sc->String);
                                        *(int *)(pBVar3 + 0x4d8) = iVar8;
                                        uVar6 = local_fc;
                                      }
                                      else {
                                        bVar7 = FScanner::Compare(sc,"PickupMessage");
                                        if (bVar7) {
                                          FScanner::MustGetString(sc);
                                          FString::operator=((FString *)(local_a0._8_8_ + 0x1c0),
                                                             sc->String);
                                          uVar6 = local_fc;
                                        }
                                        else {
                                          bVar7 = FScanner::Compare(sc,"Respawns");
                                          if (!bVar7) goto LAB_0063ca3e;
                                          pBVar3[0x4dc] = '\x01';
                                          uVar6 = local_fc;
                                        }
                                      }
                                    }
                                    else {
LAB_0063ca3e:
                                      if (def == DEF_BreakableDecoration) {
                                        bVar7 = FScanner::Compare(sc,"SolidOnDeath");
                                        if (bVar7) {
                                          local_168[0x48] = 1;
                                          uVar6 = local_fc;
                                        }
                                        else {
                                          bVar7 = FScanner::Compare(sc,"SolidOnBurn");
                                          if (!bVar7) goto LAB_0063ca7f;
                                          local_168[0x49] = 1;
                                          uVar6 = local_fc;
                                        }
                                      }
                                      else {
LAB_0063ca7f:
                                        if (*sc->String == '*') {
                                          FScanner::ScriptError(sc,(char *)0x0);
                                          uVar6 = local_fc;
                                        }
                                        else {
                                          HandleActorFlag(sc,(Baggage *)local_a0,sc->String,
                                                          (char *)0x0,0x2b);
                                          uVar6 = local_fc;
                                        }
                                      }
                                    }
                                  }
                                  goto LAB_0063c26a;
                                }
                                FScanner::MustGetNumber(sc);
                                if (0xfffe < (uint)sc->Number) {
                                  FScanner::ScriptError
                                            (sc,
                                             "Translation2 must be in the range [0,MAX_ACS_TRANSLATIONS]"
                                            );
                                }
                                uVar9 = sc->Number;
                                uVar13 = 0x40000;
                              }
                              *(uint *)(pBVar3 + 0x380) = uVar9 | uVar13;
                              uVar6 = local_fc;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0063c26a;
            }
            local_168[0x20] = 1;
          }
          FScanner::MustGetString(sc);
          if (sc->StringLen != 4) {
            FScanner::ScriptError(sc,"Sprite name must be exactly four characters long");
          }
          uVar6 = *(uint32 *)sc->String;
          if (local_168[0x20] == '\x01') {
            local_168._32_4_ = *(uint32 *)sc->String;
            uVar6 = local_fc;
          }
        }
      }
LAB_0063c26a:
      local_fc = uVar6;
      FScanner::MustGetString(sc);
      bVar7 = FScanner::Compare(sc,"}");
    } while (!bVar7);
  }
  iVar8 = GetSpriteIndex((char *)&local_fc,true);
  if ((ulong)local_168._8_8_ >> 0x20 != 0) {
    lVar16 = 0;
    do {
      *(short *)((long)(local_168._0_8_ + 0x10) + lVar16) = (short)iVar8;
      lVar16 = lVar16 + 0x28;
    } while (((ulong)local_168._8_8_ >> 0x20) * 0x28 != lVar16);
  }
  if ((local_168[0x20] != '\0') && (local_168._52_4_ != 0)) {
    iVar8 = GetSpriteIndex(local_168 + 0x20,true);
    if ((uint)local_168._48_4_ < (uint)local_168._52_4_) {
      lVar16 = (ulong)(uint)local_168._52_4_ - (local_168._48_8_ & 0xffffffff);
      pWVar15 = &((FState *)(local_168._0_8_ + (local_168._48_8_ & 0xffffffff) * 0x28))->sprite;
      do {
        *pWVar15 = (WORD)iVar8;
        pWVar15 = pWVar15 + 0x14;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
  }
  *(undefined4 *)(local_a0._8_8_ + 0xf8) = local_168._12_4_;
  if (local_168._12_4_ == 0) {
    pcVar17 = "%s does not define any animation frames";
LAB_0063cac6:
    FScanner::ScriptError(sc,pcVar17,FName::NameData.NameArray[local_dc].Text);
  }
  else {
    if (local_168._44_4_ == 0) {
      pcVar17 = "%s does not have a Frames definition";
      goto LAB_0063cac6;
    }
    if ((def == DEF_BreakableDecoration) && (local_168._52_4_ == 0)) {
      pcVar17 = "%s does not have a DeathFrames definition";
      goto LAB_0063cac6;
    }
    if ((local_168._60_4_ != 0) && (local_168[0x4c] == '\x01')) {
      FScanner::ScriptError(sc,"You cannot use IceDeathFrames and GenericIceDeath together");
    }
  }
  if (local_168._60_4_ != 0) {
    uVar9 = local_168._60_4_ - 1;
    local_d8._0_8_ = ((FState *)(local_168._0_8_ + (ulong)uVar9 * 0x28))->NextState;
    local_d8._8_8_ = ((FState *)(local_168._0_8_ + (ulong)uVar9 * 0x28))->ActionFunc;
    local_c8 = *(pair<const_PType_*,_unsigned_int> **)
                &((FState *)(local_168._0_8_ + (ulong)uVar9 * 0x28))->sprite;
    uStack_c0 = *(undefined8 *)(&((FState *)(local_168._0_8_ + (ulong)uVar9 * 0x28))->sprite + 4);
    local_b8 = *(PClass **)&((FState *)(local_168._0_8_ + (ulong)uVar9 * 0x28))->Light;
    TArray<FState,_FState>::Grow((TArray<FState,_FState> *)local_168,1);
    uVar14 = (ulong)(uint)local_168._12_4_;
    *(PClass **)&((FState *)(local_168._0_8_ + uVar14 * 0x28))->Light = local_b8;
    *(pair<const_PType_*,_unsigned_int> **)&((FState *)(local_168._0_8_ + uVar14 * 0x28))->sprite =
         local_c8;
    *(undefined8 *)(&((FState *)(local_168._0_8_ + uVar14 * 0x28))->sprite + 4) = uStack_c0;
    ((FState *)(local_168._0_8_ + uVar14 * 0x28))->NextState = (FState *)local_d8._0_8_;
    ((FState *)(local_168._0_8_ + uVar14 * 0x28))->ActionFunc = (VMFunction *)local_d8._8_8_;
    local_168._12_4_ = local_168._12_4_ + 1;
    info->NumOwnedStates = info->NumOwnedStates + 1;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)info->NumOwnedStates;
  uVar14 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar14 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pFVar11 = (FState *)operator_new__(uVar14);
  info->OwnedStates = pFVar11;
  memcpy(pFVar11,(void *)local_168._0_8_,(long)info->NumOwnedStates * 0x28);
  if (info->NumOwnedStates == 1) {
    pFVar11 = info->OwnedStates;
    pFVar11->Tics = -1;
    pFVar11->TicRange = 0;
    pFVar11->Misc1 = 0;
  }
  else {
    uVar12 = local_168._40_8_ & 0xffffffff;
    uVar14 = uVar12;
    if ((uint)local_168._40_4_ < local_168._44_4_ - 1) {
      pFVar11 = info->OwnedStates + uVar12;
      do {
        uVar14 = uVar14 + 1;
        pFVar11->NextState = pFVar11 + 1;
        pFVar11 = pFVar11 + 1;
      } while (local_168._44_4_ - 1 != uVar14);
    }
    pFVar11 = info->OwnedStates;
    pFVar11[uVar14].NextState = pFVar11 + uVar12;
    if (local_168._52_4_ != 0) {
      uVar12 = local_168._48_8_ & 0xffffffff;
      uVar14 = uVar12;
      if ((uint)local_168._48_4_ < local_168._52_4_ - 1) {
        pFVar18 = pFVar11 + uVar12;
        do {
          uVar14 = uVar14 + 1;
          pFVar18->NextState = pFVar18 + 1;
          pFVar18 = pFVar18 + 1;
        } while (local_168._52_4_ - 1 != uVar14);
      }
      if ((def == DEF_Projectile) || (local_168[0x4b] != '\0')) {
        pFVar11[uVar14].NextState = (FState *)0x0;
      }
      else {
        pFVar11[uVar14].Tics = -1;
        pFVar11[uVar14].TicRange = 0;
        pFVar11[uVar14].Misc1 = 0;
      }
      if (def == DEF_Projectile) {
        if (local_168[0x4d] == '\x01') {
          FState::SetAction(pFVar11 + uVar12,"A_Explode");
        }
      }
      else {
        FState::SetAction(pFVar11 + uVar12,"A_Scream");
        if (local_168[0x48] == '\0') {
          uVar9 = local_168._48_4_ + 1;
          uVar13 = local_168._48_4_;
          if (uVar9 < (uint)local_168._52_4_) {
            uVar13 = uVar9;
          }
          pcVar17 = "A_ScreamAndUnblock";
          if (uVar9 < (uint)local_168._52_4_) {
            pcVar17 = "A_NoBlocking";
          }
          FState::SetAction(info->OwnedStates + uVar13,pcVar17);
        }
        if ((local_118 == 0.0) && (!NAN(local_118))) {
          local_118 = *(double *)((info->super_PClass).Defaults + 0x160);
        }
        info->DeathHeight = local_118;
      }
      FStateDefinitions::SetStateLabel
                ((FStateDefinitions *)(local_a0 + 0x20),"Death",
                 info->OwnedStates + (local_168._48_8_ & 0xffffffff),'\x01');
    }
    if (local_168._68_4_ != 0) {
      uVar12 = local_168._64_8_ & 0xffffffff;
      uVar14 = uVar12;
      if ((uint)local_168._64_4_ < local_168._68_4_ - 1) {
        pFVar11 = info->OwnedStates + uVar12;
        do {
          uVar14 = uVar14 + 1;
          pFVar11->NextState = pFVar11 + 1;
          pFVar11 = pFVar11 + 1;
        } while (local_168._68_4_ - 1 != uVar14);
      }
      pFVar11 = info->OwnedStates;
      if (local_168[0x4a] == '\x01') {
        pFVar11[uVar14].NextState = (FState *)0x0;
      }
      else {
        pFVar11[uVar14].Tics = -1;
        pFVar11[uVar14].TicRange = 0;
        pFVar11[uVar14].Misc1 = 0;
      }
      FState::SetAction(info->OwnedStates + uVar12,"A_ActiveSound");
      if (local_168[0x49] == '\0') {
        uVar9 = local_168._64_4_ + 1;
        uVar13 = local_168._64_4_;
        if (uVar9 < (uint)local_168._68_4_) {
          uVar13 = uVar9;
        }
        pcVar17 = "A_ActiveAndUnblock";
        if (uVar9 < (uint)local_168._68_4_) {
          pcVar17 = "A_NoBlocking";
        }
        FState::SetAction(info->OwnedStates + uVar13,pcVar17);
      }
      if (((double)pCStack_110 == 0.0) && (!NAN((double)pCStack_110))) {
        pCStack_110 = *(Conversion **)((info->super_PClass).Defaults + 0x160);
      }
      info->BurnHeight = (double)pCStack_110;
      FStateDefinitions::SetStateLabel
                ((FStateDefinitions *)(local_a0 + 0x20),"Burn",
                 info->OwnedStates + (local_168._64_8_ & 0xffffffff),'\x01');
    }
    if (local_168._60_4_ == 0) {
      if (local_168[0x4c] != '\x01') goto LAB_0063cfbc;
      local_a8.Index = 0x90;
      pFVar11 = PClassActor::FindState
                          ((PClassActor *)AActor::RegistrationInfo.MyClass,1,&local_a8,false);
    }
    else {
      uVar14 = local_168._56_8_ & 0xffffffff;
      if ((uint)local_168._56_4_ < local_168._60_4_ - 1) {
        pFVar11 = info->OwnedStates + uVar14;
        do {
          uVar14 = uVar14 + 1;
          pFVar11->NextState = pFVar11 + 1;
          pFVar11 = pFVar11 + 1;
        } while (local_168._60_4_ - 1 != uVar14);
      }
      pFVar11 = info->OwnedStates + uVar14;
      pFVar11->NextState = info->OwnedStates + (long)info->NumOwnedStates + -1;
      pFVar11->Tics = 5;
      pFVar11->TicRange = 0;
      pFVar11->Misc1 = 0;
      FState::SetAction(pFVar11,"A_FreezeDeath");
      iVar8 = info->NumOwnedStates;
      pFVar11 = info->OwnedStates;
      pFVar18 = pFVar11 + (long)iVar8 + -1;
      pFVar18->NextState = pFVar18;
      pFVar11[(long)iVar8 + -1].Tics = 1;
      pFVar11[(long)iVar8 + -1].TicRange = 0;
      pFVar11[(long)iVar8 + -1].Misc1 = 0;
      FState::SetAction(pFVar18,"A_FreezeDeathChunks");
      pFVar11 = info->OwnedStates + (local_168._56_8_ & 0xffffffff);
    }
    FStateDefinitions::SetStateLabel((FStateDefinitions *)(local_a0 + 0x20),"Ice",pFVar11,'\x01');
  }
LAB_0063cfbc:
  if (def == DEF_BreakableDecoration) {
    uVar9 = 4;
  }
  else {
    if (def != DEF_Projectile) goto LAB_0063cfdf;
    uVar9 = 0x10400;
  }
  puVar1 = (uint *)((info->super_PClass).Defaults + 0x18c);
  *puVar1 = *puVar1 | uVar9;
LAB_0063cfdf:
  FStateDefinitions::SetStateLabel
            ((FStateDefinitions *)(local_a0 + 0x20),"Spawn",
             info->OwnedStates + (local_168._40_8_ & 0xffffffff),'\x01');
  FStateDefinitions::InstallStates
            ((FStateDefinitions *)(local_a0 + 0x20),info,(AActor *)(info->super_PClass).Defaults);
  TArray<FState,_FState>::~TArray((TArray<FState,_FState> *)local_168);
  FString::~FString(&local_40);
  TArray<FState,_FState>::~TArray((TArray<FState,_FState> *)local_58);
  TArray<FStateDefine,_FStateDefine>::~TArray
            ((TArray<FStateDefine,_FStateDefine> *)(local_a0 + 0x20));
  FString::~FString((FString *)local_a0);
  return;
}

Assistant:

void ParseOldDecoration(FScanner &sc, EDefinitionType def)
{
	Baggage bag;
	TArray<FState> StateArray;
	FExtraInfo extra;
	PClassActor *type;
	PClassActor *parent;
	FName typeName;

	parent = (def == DEF_Pickup) ? RUNTIME_CLASS(AFakeInventory) : RUNTIME_CLASS(AActor);

	sc.MustGetString();
	typeName = FName(sc.String);
	type = static_cast<PClassActor *>(parent->CreateDerivedClass (typeName, parent->Size));
	ResetBaggage(&bag, parent);
	bag.Info = type;
#ifdef _DEBUG
	bag.ClassName = type->TypeName;
#endif

	type->GameFilter = GAME_Any;
	sc.MustGetStringName("{");

	memset (&extra, 0, sizeof(extra));
	ParseInsideDecoration (bag, (AActor *)(type->Defaults), extra, def, sc, StateArray);

	bag.Info->NumOwnedStates = StateArray.Size();
	if (bag.Info->NumOwnedStates == 0)
	{
		sc.ScriptError ("%s does not define any animation frames", typeName.GetChars() );
	}
	else if (extra.SpawnEnd == 0)
	{
		sc.ScriptError ("%s does not have a Frames definition", typeName.GetChars() );
	}
	else if (def == DEF_BreakableDecoration && extra.DeathEnd == 0)
	{
		sc.ScriptError ("%s does not have a DeathFrames definition", typeName.GetChars() );
	}
	else if (extra.IceDeathEnd != 0 && extra.bGenericIceDeath)
	{
		sc.ScriptError ("You cannot use IceDeathFrames and GenericIceDeath together");
	}

	if (extra.IceDeathEnd != 0)
	{
		// Make a copy of the final frozen frame for A_FreezeDeathChunks
		FState icecopy = StateArray[extra.IceDeathEnd-1];
		StateArray.Push (icecopy);
		type->NumOwnedStates += 1;
	}

	type->OwnedStates = new FState[type->NumOwnedStates];
	memcpy (type->OwnedStates, &StateArray[0], type->NumOwnedStates * sizeof(type->OwnedStates[0]));
	if (type->NumOwnedStates == 1)
	{
		type->OwnedStates->Tics = -1;
		type->OwnedStates->TicRange = 0;
		type->OwnedStates->Misc1 = 0;
	}
	else
	{
		size_t i;

		// Spawn states loop endlessly
		for (i = extra.SpawnStart; i < extra.SpawnEnd-1; ++i)
		{
			type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
		}
		type->OwnedStates[i].NextState = &type->OwnedStates[extra.SpawnStart];

		// Death states are one-shot and freeze on the final state
		if (extra.DeathEnd != 0)
		{
			for (i = extra.DeathStart; i < extra.DeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bDiesAway || def == DEF_Projectile)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			if (def == DEF_Projectile)
			{
				if (extra.bExplosive)
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_Explode");
				}
			}
			else
			{
				// The first frame plays the death sound and
				// the second frame makes it nonsolid.
				type->OwnedStates[extra.DeathStart].SetAction("A_Scream");
				if (extra.bSolidOnDeath)
				{
				}
				else if (extra.DeathStart + 1 < extra.DeathEnd)
				{
					type->OwnedStates[extra.DeathStart+1].SetAction("A_NoBlocking");
				}
				else
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_ScreamAndUnblock");
				}

				if (extra.DeathHeight == 0)
				{
					extra.DeathHeight = ((AActor*)(type->Defaults))->Height;
				}
				type->DeathHeight = extra.DeathHeight;
			}
			bag.statedef.SetStateLabel("Death", &type->OwnedStates[extra.DeathStart]);
		}

		// Burn states are the same as death states, except they can optionally terminate
		if (extra.FireDeathEnd != 0)
		{
			for (i = extra.FireDeathStart; i < extra.FireDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bBurnAway)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			// The first frame plays the burn sound and
			// the second frame makes it nonsolid.
			type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveSound");
			if (extra.bSolidOnBurn)
			{
			}
			else if (extra.FireDeathStart + 1 < extra.FireDeathEnd)
			{
				type->OwnedStates[extra.FireDeathStart+1].SetAction("A_NoBlocking");
			}
			else
			{
				type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveAndUnblock");
			}

			if (extra.BurnHeight == 0) extra.BurnHeight = ((AActor*)(type->Defaults))->Height;
			type->BurnHeight = extra.BurnHeight;

			bag.statedef.SetStateLabel("Burn", &type->OwnedStates[extra.FireDeathStart]);
		}

		// Ice states are similar to burn and death, except their final frame enters
		// a loop that eventually causes them to bust to pieces.
		if (extra.IceDeathEnd != 0)
		{
			for (i = extra.IceDeathStart; i < extra.IceDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			type->OwnedStates[i].NextState = &type->OwnedStates[type->NumOwnedStates-1];
			type->OwnedStates[i].Tics = 5;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeath");

			i = type->NumOwnedStates - 1;
			type->OwnedStates[i].NextState = &type->OwnedStates[i];
			type->OwnedStates[i].Tics = 1;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeathChunks");
			bag.statedef.SetStateLabel("Ice", &type->OwnedStates[extra.IceDeathStart]);
		}
		else if (extra.bGenericIceDeath)
		{
			bag.statedef.SetStateLabel("Ice", RUNTIME_CLASS(AActor)->FindState(NAME_GenericFreezeDeath));
		}
	}
	if (def == DEF_BreakableDecoration)
	{
		((AActor *)(type->Defaults))->flags |= MF_SHOOTABLE;
	}
	if (def == DEF_Projectile)
	{
		((AActor *)(type->Defaults))->flags |= MF_DROPOFF|MF_MISSILE;
	}
	bag.statedef.SetStateLabel("Spawn", &type->OwnedStates[extra.SpawnStart]);
	bag.statedef.InstallStates (type, ((AActor *)(type->Defaults)));
}